

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

size_t __thiscall Apt::AddTaxiEdge(Apt *this,size_t n1,size_t n2,edgeTy _type)

{
  iterator iVar1;
  ulong uVar2;
  pointer pTVar3;
  size_t sVar4;
  pointer pTVar5;
  size_t eIdx;
  double local_50;
  edgeTy local_44;
  size_t local_40;
  size_t local_38;
  double local_30;
  
  pTVar3 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)pTVar3 >> 6;
  sVar4 = n1;
  local_44 = _type;
  local_40 = n2;
  local_38 = n1;
  if ((uVar2 <= n1) || (sVar4 = n2, uVar2 <= n2)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",sVar4,
               uVar2);
  }
  pTVar5 = pTVar3 + n1;
  if ((!NAN(pTVar5->lat)) && (!NAN(pTVar5->lon))) {
    pTVar3 = pTVar3 + n2;
    if ((!NAN(pTVar3->lat)) && (!NAN(pTVar3->lon))) {
      local_50 = CoordAngle(pTVar5->lat,pTVar5->lon,pTVar3->lat,pTVar3->lon);
      local_30 = DistLatLonSqr(pTVar5->lat,pTVar5->lon,pTVar3->lat,pTVar3->lon);
      if (local_30 < 0.0) {
        local_30 = sqrt(local_30);
      }
      else {
        local_30 = SQRT(local_30);
      }
      std::vector<TaxiEdge,std::allocator<TaxiEdge>>::
      emplace_back<TaxiEdge::edgeTy&,unsigned_long&,unsigned_long&,double,double>
                ((vector<TaxiEdge,std::allocator<TaxiEdge>> *)&this->vecTaxiEdges,&local_44,
                 &local_38,&local_40,&local_50,&local_30);
      local_50 = (double)(((long)(this->vecTaxiEdges).
                                 super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(this->vecTaxiEdges).
                                 super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1);
      iVar1._M_current =
           *(pointer *)
            ((long)&(pTVar5->vecEdges).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar1._M_current ==
          *(pointer *)
           ((long)&(pTVar5->vecEdges).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pTVar5->vecEdges,iVar1,
                   (unsigned_long *)&local_50);
      }
      else {
        *iVar1._M_current = (unsigned_long)local_50;
        *(unsigned_long **)
         ((long)&(pTVar5->vecEdges).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar1._M_current + 1;
      }
      iVar1._M_current =
           *(pointer *)
            ((long)&(pTVar3->vecEdges).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar1._M_current !=
          *(pointer *)
           ((long)&(pTVar3->vecEdges).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        *iVar1._M_current = (unsigned_long)local_50;
        *(unsigned_long **)
         ((long)&(pTVar3->vecEdges).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar1._M_current + 1;
        return (size_t)local_50;
      }
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pTVar3->vecEdges,iVar1,
                 (unsigned_long *)&local_50);
      return (size_t)local_50;
    }
  }
  if ((int)dataRefs.iLogLevel < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp",
           0x1f2,"AddTaxiEdge",logDEBUG,"apt.dat: Node %lu or %lu invalid! Edge not added.",n1,n2);
  }
  return (size_t)-NAN;
}

Assistant:

size_t AddTaxiEdge (size_t n1, size_t n2,
                        TaxiEdge::edgeTy _type = TaxiEdge::TAXI_WAY)
    {
        // Actual nodes must be valid, throws exception if not
        TaxiNode& a = vecTaxiNodes.at(n1);
        TaxiNode& b = vecTaxiNodes.at(n2);
        if (!a.HasGeoCoords() || !b.HasGeoCoords())
        {
            LOG_MSG(logDEBUG, "apt.dat: Node %lu or %lu invalid! Edge not added.",
                    (long unsigned)n1, (long unsigned)n2);
            return ULONG_MAX;
        }
        
        // Add the edge
        vecTaxiEdges.emplace_back(_type, n1, n2,
                                  CoordAngle(a.lat, a.lon, b.lat, b.lon),
                                  DistLatLon(a.lat, a.lon, b.lat, b.lon));
        
        // Tell the nodes they've got a new connection
        const size_t eIdx = vecTaxiEdges.size()-1;
        a.vecEdges.push_back(eIdx);
        b.vecEdges.push_back(eIdx);
        
        return eIdx;
    }